

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP4Writer::WriteCollectiveMetadataFile(BP4Writer *this,bool isFinal)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  TransportMan *this_00;
  mapped_type *pmVar6;
  long lVar7;
  mapped_type *currentTimeStamp_00;
  mapped_type *this_01;
  reference pvVar8;
  mapped_type *currentStep;
  mapped_type *this_02;
  size_type sVar9;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *puVar10;
  byte in_SIL;
  long in_RDI;
  size_t i_1;
  uint64_t currentStepEndPosMetadataFile;
  uint64_t attrIndexStartMetadataFile;
  uint64_t varIndexStartMetadataFile;
  uint64_t pgIndexStartMetadataFile;
  unsigned_long *t;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  size_t rowsInMetadataIndexTable;
  pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *pair;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> timeSteps;
  time_t currentTimeStamp;
  size_t i;
  ScopedTimer __var2633;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_fffffffffffffde8;
  BP4Serializer *in_stack_fffffffffffffdf0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffdf8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  FileDrainer *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe20;
  BufferSTL *in_stack_fffffffffffffe38;
  BP4Writer *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  FileDrainer *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe70;
  undefined2 uVar11;
  Buffer *in_stack_fffffffffffffe78;
  BPBase *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  int iVar12;
  TransportMan *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  TransportMan *in_stack_fffffffffffffea0;
  size_type local_138;
  string *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 inMetadataBuffer;
  BufferSTL *in_stack_ffffffffffffff30;
  Comm *in_stack_ffffffffffffff38;
  BP4Serializer *in_stack_ffffffffffffff40;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_88;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_80;
  long local_78;
  mapped_type *local_70;
  long local_68;
  time_t local_48;
  ulong local_40;
  undefined4 local_34;
  undefined1 local_11;
  
  uVar11 = (undefined2)((ulong)in_stack_fffffffffffffe70 >> 0x30);
  iVar12 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  inMetadataBuffer = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  local_11 = in_SIL & 1;
  if ((WriteCollectiveMetadataFile(bool)::__var633 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&WriteCollectiveMetadataFile(bool)::__var633), iVar4 != 0)) {
    WriteCollectiveMetadataFile::__var633 =
         (void *)ps_timer_create_("BP4Writer::WriteCollectiveMetadataFile");
    __cxa_guard_release(&WriteCollectiveMetadataFile(bool)::__var633);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  if (((local_11 & 1) == 0) ||
     (*(long *)(in_RDI + 0x260 + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18)) != 0)) {
    adios2::format::BP4Serializer::AggregateCollectiveMetadata
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (bool)inMetadataBuffer);
    if (*(int *)(in_RDI + 0xd0 + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18)) == 0) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xa31f73);
      transportman::TransportMan::WriteFiles
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (size_t)in_stack_fffffffffffffe90,iVar12);
      transportman::TransportMan::FlushFiles(in_stack_fffffffffffffe90,iVar12);
      if ((*(byte *)(in_RDI + 0x749) & 1) != 0) {
        for (local_40 = 0; uVar2 = local_40,
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(in_RDI + 0x8c8)), uVar2 < sVar5; local_40 = local_40 + 1) {
          in_stack_fffffffffffffe98 = (char *)(in_RDI + 0x750);
          in_stack_fffffffffffffea0 =
               (TransportMan *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x8c8),local_40);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x8e0),local_40);
          burstbuffer::FileDrainer::AddOperationCopy
                    (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                     (string *)in_stack_fffffffffffffe00._M_current,
                     (size_t)in_stack_fffffffffffffdf8._M_current);
        }
      }
      local_48 = time((time_t *)0x0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa320f3);
      local_68 = (long)*(int *)(in_RDI + 0xd0 + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18));
      this_00 = (TransportMan *)
                std::
                unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                              *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
      std::
      unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::size((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)0xa32144);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_78 = (long)*(int *)(in_RDI + 0xd0 + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18));
      pmVar6 = std::
               unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                             *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
      local_70 = pmVar6;
      local_80._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::begin(in_stack_fffffffffffffde8);
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::end(in_stack_fffffffffffffde8);
      while (bVar3 = std::__detail::operator!=(&local_80,&local_88), bVar3) {
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
        ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                     *)0xa321fc);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffe00._M_current,in_stack_fffffffffffffdf8._M_current);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
        ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>
                      *)in_stack_fffffffffffffdf0);
      }
      in_stack_fffffffffffffe80 = (BPBase *)&stack0xffffffffffffffa0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde8)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde8)
      ;
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &stack0xffffffffffffffa0);
      lVar7 = (sVar5 + 1) * 0x40;
      in_stack_fffffffffffffe78 = (Buffer *)&stack0xffffffffffffff37;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff38,"BP4 Index Table",
                 (allocator *)in_stack_fffffffffffffe78);
      adios2::format::BufferSTL::Resize
                ((BufferSTL *)in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde8)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde8)
      ;
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffdf0,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffde8);
        iVar12 = (int)((ulong)pmVar6 >> 0x20);
        if (!bVar3) break;
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)&stack0xffffffffffffff20);
        currentTimeStamp_00 =
             std::
             unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                           *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        this_01 = std::
                  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_01,0);
        in_stack_fffffffffffffe50 =
             (FileDrainer *)
             std::
             unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                           *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        in_stack_fffffffffffffe48 =
             (string *)
             std::
             unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffe48,1);
        in_stack_fffffffffffffe40 =
             (BP4Writer *)
             std::
             unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                           *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        in_stack_fffffffffffffe38 =
             (BufferSTL *)
             std::
             unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffe38,2);
        lVar1 = *(long *)(*(long *)(in_RDI + 0xc0) + -0x18);
        puVar10 = (unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)(*pvVar8 + *(long *)(in_RDI + 0x2b8 + lVar1) + *(long *)(in_RDI + 0xe0 + lVar1)
                     );
        currentStep = std::
                      unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                    *)in_stack_fffffffffffffdf0,
                                   (key_type *)in_stack_fffffffffffffde8);
        this_02 = std::
                  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_02,3);
        lVar1 = *(long *)(*(long *)(in_RDI + 0xc0) + -0x18);
        in_stack_fffffffffffffdf0 =
             (BP4Serializer *)
             (*pvVar8 + *(long *)(in_RDI + 0x2b8 + lVar1) + *(long *)(in_RDI + 0xe0 + lVar1));
        PopulateMetadataIndexFileContent
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(uint64_t)currentStep,
                   (uint64_t)this_02,(uint64_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                   (uint64_t)in_stack_fffffffffffffe50,(uint64_t)this_01,
                   (uint64_t)currentTimeStamp_00);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)&stack0xffffffffffffff20);
        in_stack_fffffffffffffde8 = puVar10;
      }
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xa326f7);
      transportman::TransportMan::WriteFiles
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(size_t)this_00,iVar12);
      transportman::TransportMan::FlushFiles(this_00,iVar12);
      uVar11 = (undefined2)((ulong)lVar7 >> 0x30);
      lVar1 = *(long *)(*(long *)(in_RDI + 0xc0) + -0x18);
      *(long *)(in_RDI + 0x2b8 + lVar1) =
           *(long *)(in_RDI + 0x178 + *(long *)(*(long *)(in_RDI + 0xc0) + -0x18)) +
           *(long *)(in_RDI + 0x2b8 + lVar1);
      if ((*(byte *)(in_RDI + 0x749) & 1) != 0) {
        local_138 = 0;
        while( true ) {
          sVar5 = local_138;
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(in_RDI + 0x8f8));
          uVar11 = (undefined2)((ulong)lVar7 >> 0x30);
          if (sVar9 <= sVar5) break;
          in_stack_fffffffffffffe00._M_current = (unsigned_long *)(in_RDI + 0x750);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x910),local_138);
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0xa32805);
          burstbuffer::FileDrainer::AddOperationWrite
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                     (size_t)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          local_138 = local_138 + 1;
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffe00._M_current);
    }
    adios2::format::BPBase::ResetBuffer
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,SUB21((ushort)uVar11 >> 8,0),
               SUB21(uVar11,0));
    adios2::format::BPBase::ResetBuffer
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,SUB21((ushort)uVar11 >> 8,0),
               SUB21(uVar11,0));
    adios2::format::BP4Serializer::ResetMetadataIndexTable((BP4Serializer *)0xa328d1);
    adios2::format::BP4Serializer::ResetAllIndices(in_stack_fffffffffffffdf0);
    local_34 = 0;
  }
  else {
    local_34 = 1;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void BP4Writer::WriteCollectiveMetadataFile(const bool isFinal)
{

    PERFSTUBS_SCOPED_TIMER("BP4Writer::WriteCollectiveMetadataFile");

    if (isFinal && m_BP4Serializer.m_MetadataSet.DataPGCount == 0)
    {
        // If data pg count is zero, it means all metadata
        // has already been written, don't need to write it again.
        return;
    }
    m_BP4Serializer.AggregateCollectiveMetadata(m_Comm, m_BP4Serializer.m_Metadata, true);

    if (m_BP4Serializer.m_RankMPI == 0)
    {

        m_FileMetadataManager.WriteFiles(m_BP4Serializer.m_Metadata.m_Buffer.data(),
                                         m_BP4Serializer.m_Metadata.m_Position);
        m_FileMetadataManager.FlushFiles();

        if (m_DrainBB)
        {
            for (size_t i = 0; i < m_MetadataFileNames.size(); ++i)
            {
                m_FileDrainer.AddOperationCopy(m_MetadataFileNames[i], m_DrainMetadataFileNames[i],
                                               m_BP4Serializer.m_Metadata.m_Position);
            }
        }

        std::time_t currentTimeStamp = std::time(nullptr);

        std::vector<size_t> timeSteps;
        timeSteps.reserve(m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI].size());
        for (auto const &pair : m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI])
        {
            timeSteps.push_back(pair.first);
        }
        std::sort(timeSteps.begin(), timeSteps.end());

        size_t rowsInMetadataIndexTable = timeSteps.size() + 1;
        m_BP4Serializer.m_MetadataIndex.Resize(rowsInMetadataIndexTable * 64, "BP4 Index Table");
        for (auto const &t : timeSteps)
        {
            const uint64_t pgIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][0] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t varIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][1] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t attrIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][2] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t currentStepEndPosMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][3] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            PopulateMetadataIndexFileContent(m_BP4Serializer.m_MetadataIndex, t,
                                             m_BP4Serializer.m_RankMPI, pgIndexStartMetadataFile,
                                             varIndexStartMetadataFile, attrIndexStartMetadataFile,
                                             currentStepEndPosMetadataFile, currentTimeStamp);
        }

        m_FileMetadataIndexManager.WriteFiles(m_BP4Serializer.m_MetadataIndex.m_Buffer.data(),
                                              m_BP4Serializer.m_MetadataIndex.m_Position);
        m_FileMetadataIndexManager.FlushFiles();

        m_BP4Serializer.m_MetadataSet.MetadataFileLength += m_BP4Serializer.m_Metadata.m_Position;

        if (m_DrainBB)
        {
            for (size_t i = 0; i < m_MetadataIndexFileNames.size(); ++i)
            {
                m_FileDrainer.AddOperationWrite(m_DrainMetadataIndexFileNames[i],
                                                m_BP4Serializer.m_MetadataIndex.m_Position,
                                                m_BP4Serializer.m_MetadataIndex.m_Buffer.data());
            }
        }
    }
    /*Clear the local indices buffer at the end of each step*/
    m_BP4Serializer.ResetBuffer(m_BP4Serializer.m_Metadata, true, true);

    /* clear the metadata index buffer*/
    m_BP4Serializer.ResetBuffer(m_BP4Serializer.m_MetadataIndex, true, true);

    /* reset the metadata index table*/
    m_BP4Serializer.ResetMetadataIndexTable();
    m_BP4Serializer.ResetAllIndices();
}